

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O2

vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
* LDPC4QKD::RateAdaptiveCode<unsigned_short>::compute_mother_pos_varn<unsigned_int>
            (vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *__return_storage_ptr__,vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
            vector<unsigned_short,_std::allocator<unsigned_short>_> *rowIdx)

{
  pointer puVar1;
  pointer puVar2;
  ushort uVar3;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var4;
  pointer puVar5;
  ulong uVar6;
  allocator_type local_49;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  puVar1 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _Var4 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(__return_storage_ptr__,(ulong)*_Var4._M_current + 1,(value_type *)&local_48,&local_49);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
  uVar3 = 0;
  while( true ) {
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT62(local_48._M_impl.super__Vector_impl_data._M_start._2_6_,uVar3);
    if (((long)puVar1 - (long)puVar2 >> 2) - 1U <= (ulong)uVar3) break;
    puVar5 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (ulong)puVar5[uVar3];
    for (; uVar6 < puVar5[(ulong)uVar3 + 1]; uVar6 = uVar6 + 1) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start +
                 (rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar6],(value_type_conflict2 *)&local_48);
      puVar5 = (colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (ushort)local_48._M_impl.super__Vector_impl_data._M_start;
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<idx_t>> compute_mother_pos_varn(
                const std::vector<colptr_t> &colptr,
                const std::vector<idx_t> &rowIdx) {
            // number of columns in full matrix represented by given compressed sparse column (CSC) storage
            const auto nCols = colptr.size() - 1;
            // number of rows in full matrix represented by given compressed sparse column (CSC) storage
            const auto nMotherRows = *std::max_element(rowIdx.begin(), rowIdx.end()) + 1u;

            std::vector<std::vector<idx_t>> pos_varn_tmp{nMotherRows, std::vector<idx_t>{}};
            for (idx_t col = 0; col < nCols; col++) {
                for (auto j = colptr[col]; j < colptr[col + 1u]; j++) {
                    pos_varn_tmp[rowIdx[j]].push_back(col);
                }
            }
            return pos_varn_tmp;
        }